

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O1

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::FixedSizeInitScan(duckdb *this,ColumnSegment *segment)

{
  FixedSizeScanState *pFVar1;
  BufferManager *pBVar2;
  pointer pFVar3;
  pointer *__ptr;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::FixedSizeScanState_*,_false> local_38;
  BufferHandle local_30;
  
  pFVar1 = (FixedSizeScanState *)operator_new(0x20);
  (pFVar1->super_SegmentScanState)._vptr_SegmentScanState = (_func_int **)0x0;
  (pFVar1->handle).handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (pFVar1->handle).handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pFVar1->handle).node.ptr = (FileBuffer *)0x0;
  (pFVar1->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__FixedSizeScanState_019a5548;
  BufferHandle::BufferHandle(&pFVar1->handle);
  local_38._M_head_impl = pFVar1;
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&local_30,pBVar2,&segment->block);
  pFVar3 = unique_ptr<duckdb::FixedSizeScanState,_std::default_delete<duckdb::FixedSizeScanState>,_true>
           ::operator->((unique_ptr<duckdb::FixedSizeScanState,_std::default_delete<duckdb::FixedSizeScanState>,_true>
                         *)&local_38);
  BufferHandle::operator=(&pFVar3->handle,&local_30);
  BufferHandle::~BufferHandle(&local_30);
  *(FixedSizeScanState **)this = local_38._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> FixedSizeInitScan(ColumnSegment &segment) {
	auto result = make_uniq<FixedSizeScanState>();
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	result->handle = buffer_manager.Pin(segment.block);
	return std::move(result);
}